

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void float64_suite::test_zero(void)

{
  value vVar1;
  undefined4 uVar2;
  value_type input [9];
  decoder decoder;
  return_type local_70;
  ulong local_68;
  uchar local_60 [16];
  decoder local_50;
  
  local_50.input._M_str = local_60;
  local_60[8] = 0;
  local_60[0] = 0xd7;
  local_60[1] = '\0';
  local_60[2] = '\0';
  local_60[3] = '\0';
  local_60[4] = '\0';
  local_60[5] = '\0';
  local_60[6] = '\0';
  local_60[7] = '\0';
  local_50.input._M_len = 9;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_70._0_4_ = local_50.current.code;
  local_68._0_4_ = 0xd7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x31d,"void float64_suite::test_zero()",&local_70,&local_68);
  local_70._0_4_ = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_68._0_4_ = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x31e,"void float64_suite::test_zero()",&local_70,&local_68);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  uVar2 = 0;
  if (vVar1 - null < 0xc) {
    uVar2 = *(undefined4 *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_70 = (return_type)CONCAT44(local_70._4_4_,uVar2);
  local_68 = CONCAT44(local_68._4_4_,2);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,799,"void float64_suite::test_zero()",&local_70,&local_68);
  local_70 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float64>::decode(&local_50);
  local_68 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("decoder.value<token::float64>()","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,800,"void float64_suite::test_zero()",&local_70,&local_68);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_70 = (return_type)CONCAT44(local_70._4_4_,local_50.current.code);
  local_68 = local_68 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x322,"void float64_suite::test_zero()",&local_70,&local_68);
  return;
}

Assistant:

void test_zero()
{
    const value_type input[] = { token::code::float64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::float64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::real);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::float64>(), 0.0);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}